

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

ssize_t __thiscall JSON::JSON_array::write(JSON_array *this,int __fd,void *__buf,size_t __n)

{
  pointer pJVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Pipeline *this_00;
  JSON *element;
  pointer element_00;
  bool first;
  bool local_31;
  
  this_00 = (Pipeline *)CONCAT44(in_register_00000034,__fd);
  Pipeline::operator<<(this_00,"[");
  local_31 = true;
  element_00 = (this->elements).super__Vector_base<JSON,_std::allocator<JSON>_>._M_impl.
               super__Vector_impl_data._M_start;
  pJVar1 = (this->elements).super__Vector_base<JSON,_std::allocator<JSON>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (element_00 != pJVar1) {
    do {
      writeArrayItem(this_00,&local_31,element_00,(long)__buf + 1);
      element_00 = element_00 + 1;
    } while (element_00 != pJVar1);
  }
  writeClose(this_00,local_31,(size_t)__buf,"]");
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_array::write(Pipeline* p, size_t depth) const
{
    bool first = true;
    writeArrayOpen(p, first, depth);
    for (auto const& element: elements) {
        writeArrayItem(p, first, element, 1 + depth);
    }
    writeArrayClose(p, first, depth);
}